

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  ImWchar IVar1;
  ImFont *this;
  undefined4 uVar2;
  undefined4 uVar3;
  char *text_end;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  ImDrawList *draw_list_00;
  ImVec2 *pIVar6;
  ImWchar c;
  int iVar7;
  ImU32 col;
  ImFontGlyph *pIVar8;
  char *text_display_end;
  int iVar9;
  ImGuiContext *g;
  ImGuiContext *pIVar10;
  uint uVar11;
  ImVec2 IVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float fVar15;
  float local_bc;
  char *text_end_ellipsis;
  char *local_b0;
  ImVec2 *local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  float local_90;
  uint local_8c;
  uint unused;
  float fStack_80;
  float fStack_7c;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 *local_60;
  ImDrawList *local_58;
  ImGuiContext *local_50;
  float local_48;
  undefined8 extraout_XMM0_Qb;
  
  pIVar10 = GImGui;
  local_b0 = (char *)CONCAT44(local_b0._4_4_,clip_max_x);
  if ((text_end_full == (char *)0x0) && (text_end_full = text, text != (char *)0xffffffffffffffff))
  {
    do {
      if (*text_end_full == '#') {
        if (text_end_full[1] == '#') goto LAB_001e470e;
      }
      else if (*text_end_full == '\0') goto LAB_001e470e;
      text_end_full = text_end_full + 1;
    } while (text_end_full != (char *)0xffffffffffffffff);
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_001e470e:
  local_48 = ellipsis_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_end_full == text) {
      local_98 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar13._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_end_full,
                      (char **)0x0);
      auVar13._8_8_ = extraout_XMM0_Qb;
      auVar14._4_12_ = auVar13._4_12_;
      auVar14._0_4_ = (float)(int)(auVar13._0_4_ + 0.99999);
      local_98 = auVar14._0_8_;
    }
  }
  else {
    local_98 = *text_size_if_known;
  }
  if (local_98.x <= pos_max->x - pos_min->x) {
    unique0x1000057e = pos_max->y;
    unused = SUB84(local_b0,0);
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&unused,text,text_end_full,&local_98,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    local_50 = pIVar10;
    this = draw_list->_Data->Font;
    size = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    IVar1 = this->EllipsisChar;
    iVar9 = 1;
    c = IVar1;
    if (IVar1 == 0xffff) {
      c = this->DotChar;
      iVar9 = 3;
    }
    local_8c = (uint)c;
    local_a8 = pos_min;
    local_60 = pos_max;
    pIVar8 = ImFont::FindGlyph(this,c);
    local_90 = pIVar8->X1;
    local_bc = local_90;
    if (IVar1 == 0xffff) {
      fVar15 = draw_list->_Data->FontSize / this->FontSize;
      local_bc = (local_90 - pIVar8->X0) + fVar15;
      local_90 = (float)iVar9 * local_bc - fVar15;
    }
    uVar11 = -(uint)(local_48 <= local_60->x);
    fVar15 = ((float)(~uVar11 & (uint)local_48 | (uint)local_60->x & uVar11) - local_90) -
             local_a8->x;
    if (fVar15 <= 1.0) {
      fVar15 = 1.0;
    }
    local_58 = draw_list;
    local_78 = ImFont::CalcTextSizeA(this,size,fVar15,0.0,text,text_end_full,&text_end_ellipsis);
    uStack_70 = extraout_XMM0_Qb_00;
    text_end = text_end_ellipsis;
    pIVar4 = local_a8;
    pIVar5 = local_60;
    draw_list_00 = local_58;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == text) {
      _unused = (ImVec2)((ulong)_unused & 0xffffffff00000000);
      iVar7 = ImTextCharFromUtf8(&unused,text,text_end_full);
      text_end_ellipsis = text + iVar7;
      local_78 = ImFont::CalcTextSizeA
                           (this,size,3.4028235e+38,0.0,text,text_end_ellipsis,(char **)0x0);
      uStack_70 = extraout_XMM0_Qb_01;
      text_end = text_end_ellipsis;
      pIVar4 = local_a8;
      pIVar5 = local_60;
      draw_list_00 = local_58;
    }
    while ((pIVar6 = local_60, pos_min = local_a8, local_a8 = pIVar4, local_58 = draw_list_00,
           text < text_end && ((text_end[-1] == ' ' || (text_end[-1] == '\t'))))) {
      text_end_ellipsis = text_end + -1;
      local_60 = pIVar5;
      IVar12 = ImFont::CalcTextSizeA
                         (this,size,3.4028235e+38,0.0,text_end_ellipsis,text_end,(char **)0x0);
      local_78.x = local_78.x - IVar12.x;
      text_end = text_end_ellipsis;
      pIVar4 = local_a8;
      pIVar5 = local_60;
      draw_list_00 = local_58;
      local_60 = pIVar6;
      local_a8 = pos_min;
    }
    unique0x1000058e = local_60->y;
    unused = SUB84(local_b0,0);
    local_a0.x = 0.0;
    local_a0.y = 0.0;
    text_end_ellipsis = text_end;
    local_b0 = text;
    local_60 = pIVar5;
    RenderTextClippedEx(draw_list_00,pos_min,(ImVec2 *)&unused,text,text_end,&local_98,&local_a0,
                        (ImRect *)0x0);
    uVar11 = local_8c;
    fVar15 = local_78.x + pos_min->x;
    text = local_b0;
    pIVar10 = local_50;
    if (local_90 + fVar15 <= local_48) {
      do {
        local_78.x = fVar15;
        local_a0.y = pos_min->y;
        local_a0.x = fVar15;
        unused = (GImGui->Style).Colors[0].x;
        unique0x1000051e = (GImGui->Style).Colors[0].y;
        uVar2 = (GImGui->Style).Colors[0].z;
        uVar3 = (GImGui->Style).Colors[0].w;
        fStack_7c = (GImGui->Style).Alpha * (float)uVar3;
        fStack_80 = (float)uVar2;
        col = ColorConvertFloat4ToU32((ImVec4 *)&unused);
        ImFont::RenderChar(this,draw_list_00,size,&local_a0,col,(ImWchar)uVar11);
        fVar15 = local_78.x + local_bc;
        iVar9 = iVar9 + -1;
        text = local_b0;
        pIVar10 = local_50;
      } while (iVar9 != 0);
    }
  }
  if (pIVar10->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = font->DotChar;
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}